

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_compact_cell_id_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT cell_id,REF_GLOB *nnode_global,
          REF_LONG *ncell_global,REF_GLOB **l2c)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_STATUS RVar3;
  uint uVar4;
  uint uVar5;
  REF_GLOB *pRVar6;
  void *array;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  int local_d0;
  REF_INT nnode;
  REF_INT local_c8;
  REF_INT part;
  REF_MPI local_c0;
  long *local_b8;
  long *local_b0;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  lVar13 = (long)ref_node->max;
  local_c8 = cell_id;
  if (lVar13 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x223,
           "ref_grid_compact_cell_id_nodes","malloc *l2c of REF_GLOB negative");
    uVar4 = 1;
  }
  else {
    local_c0 = ref_grid->mpi;
    pRVar6 = (REF_GLOB *)malloc(lVar13 * 8);
    *l2c = pRVar6;
    if (pRVar6 == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x223,
             "ref_grid_compact_cell_id_nodes","malloc *l2c of REF_GLOB NULL");
      uVar4 = 2;
    }
    else {
      for (lVar7 = 0; lVar13 != lVar7; lVar7 = lVar7 + 1) {
        pRVar6[lVar7] = -1;
      }
      *nnode_global = 0;
      *ncell_global = 0;
      nnode = 0;
      iVar14 = 0;
      local_d0 = 0;
      local_b8 = nnode_global;
      local_b0 = ncell_global;
      for (iVar11 = 0; ref_mpi = local_c0, iVar11 < ref_cell->max; iVar11 = iVar11 + 1) {
        RVar3 = ref_cell_nodes(ref_cell,iVar11,nodes);
        if ((RVar3 == 0) && (nodes[ref_cell->node_per] == local_c8)) {
          uVar4 = ref_cell_part(ref_cell,ref_node,iVar11,&part);
          if (uVar4 != 0) {
            pcVar12 = "part";
            uVar10 = 0x22c;
            goto LAB_0012d3a1;
          }
          iVar1 = local_c0->id;
          uVar8 = (ulong)(uint)ref_cell->node_per;
          if (ref_cell->node_per < 1) {
            uVar8 = 0;
          }
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            iVar2 = nodes[uVar9];
            if ((ref_node->ref_mpi->id == ref_node->part[iVar2]) && ((*l2c)[iVar2] == -1)) {
              (*l2c)[iVar2] = (long)iVar14;
              iVar14 = iVar14 + 1;
              nnode = iVar14;
            }
          }
          local_d0 = local_d0 + (uint)(iVar1 == part);
        }
      }
      *local_b0 = (long)local_d0;
      uVar4 = 1;
      uVar5 = ref_mpi_allsum(local_c0,local_b0,1,2);
      if (uVar5 == 0) {
        if ((long)ref_mpi->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x23d,"ref_grid_compact_cell_id_nodes","malloc counts of REF_INT negative");
        }
        else {
          array = malloc((long)ref_mpi->n << 2);
          if (array == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x23d,"ref_grid_compact_cell_id_nodes","malloc counts of REF_INT NULL");
            uVar4 = 2;
          }
          else {
            uVar4 = ref_mpi_allgather(ref_mpi,&nnode,array,1);
            if (uVar4 == 0) {
              uVar9 = 0;
              uVar8 = (ulong)(uint)ref_mpi->id;
              if (ref_mpi->id < 1) {
                uVar8 = uVar9;
              }
              iVar11 = 0;
              for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                iVar11 = iVar11 + *(int *)((long)array + uVar9 * 4);
              }
              uVar9 = 0;
              uVar8 = (ulong)(uint)ref_mpi->n;
              if (ref_mpi->n < 1) {
                uVar8 = uVar9;
              }
              for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                *local_b8 = *local_b8 + (long)*(int *)((long)array + uVar9 * 4);
              }
              free(array);
              uVar9 = 0;
              uVar8 = (ulong)(uint)ref_node->max;
              if (ref_node->max < 1) {
                uVar8 = uVar9;
              }
              pRVar6 = *l2c;
              for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                if (pRVar6[uVar9] != -1) {
                  pRVar6[uVar9] = pRVar6[uVar9] + (long)iVar11;
                }
              }
              uVar4 = ref_node_ghost_glob(ref_node,pRVar6,1);
              if (uVar4 == 0) {
                return 0;
              }
              pcVar12 = "xfer";
              uVar10 = 0x24c;
            }
            else {
              pcVar12 = "gather size";
              uVar10 = 0x23e;
            }
LAB_0012d3a1:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   uVar10,"ref_grid_compact_cell_id_nodes",(ulong)uVar4,pcVar12);
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x23b,"ref_grid_compact_cell_id_nodes",(ulong)uVar5,"allsum");
        uVar4 = uVar5;
      }
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_cell_id_nodes(
    REF_GRID ref_grid, REF_CELL ref_cell, REF_INT cell_id,
    REF_GLOB *nnode_global, REF_LONG *ncell_global, REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_INT offset;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        ncell++;
      }
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (ref_node_owned(ref_node, nodes[cell_node]) &&
            (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
          (*l2c)[nodes[cell_node]] = nnode;
          nnode++;
        }
      }
    }
  }

  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }